

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O0

int mc_packremote(lua_State *L)

{
  void *__src;
  ulong __size;
  void *__dest;
  void *msg;
  size_t size;
  void *data;
  lua_State *L_local;
  
  __src = lua_touserdata(L,1);
  __size = luaL_checkinteger(L,2);
  if (__size == (__size & 0xffffffff)) {
    __dest = malloc(__size);
    memcpy(__dest,__src,__size);
    L_local._4_4_ = pack(L,__dest,__size);
  }
  else {
    L_local._4_4_ = luaL_error(L,"Size should be 32bit integer");
  }
  return L_local._4_4_;
}

Assistant:

static int
mc_packremote(lua_State *L) {
	void * data = lua_touserdata(L, 1);
	size_t size = (size_t)luaL_checkinteger(L, 2);
	if (size != (uint32_t)size) {
		return luaL_error(L, "Size should be 32bit integer");
	}
	void * msg = skynet_malloc(size);
	memcpy(msg, data, size);
	return pack(L, msg, size);
}